

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3 *pMP3,ma_uint64 frameIndex)

{
  ma_dr_mp3 *in_RSI;
  long in_RDI;
  ma_uint64 in_stack_00000020;
  ma_dr_mp3 *in_stack_00000028;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x1a20) == 0)) {
    local_4 = 0;
  }
  else if (in_RSI == (ma_dr_mp3 *)0x0) {
    local_4 = ma_dr_mp3_seek_to_start_of_stream((ma_dr_mp3 *)0x0);
  }
  else if ((*(long *)(in_RDI + 0x3e70) == 0) || (*(int *)(in_RDI + 0x3e78) == 0)) {
    local_4 = ma_dr_mp3_seek_to_pcm_frame__brute_force(in_RSI,0x1ed804);
  }
  else {
    local_4 = ma_dr_mp3_seek_to_pcm_frame__seek_table(in_stack_00000028,in_stack_00000020);
  }
  return local_4;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_seek_to_pcm_frame(ma_dr_mp3* pMP3, ma_uint64 frameIndex)
{
    if (pMP3 == NULL || pMP3->onSeek == NULL) {
        return MA_FALSE;
    }
    if (frameIndex == 0) {
        return ma_dr_mp3_seek_to_start_of_stream(pMP3);
    }
    if (pMP3->pSeekPoints != NULL && pMP3->seekPointCount > 0) {
        return ma_dr_mp3_seek_to_pcm_frame__seek_table(pMP3, frameIndex);
    } else {
        return ma_dr_mp3_seek_to_pcm_frame__brute_force(pMP3, frameIndex);
    }
}